

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O1

void incdec_verify::PostIncTestInt8(void)

{
  char t;
  bool expected;
  long lVar1;
  string local_50;
  
  lVar1 = 2;
  do {
    t = (&UNK_0014d6de)[lVar1];
    if (t == '\x7f') {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    expected = (bool)(&inc_int8)[lVar1];
    if (expected != true) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case inc_int8 throw (2): ","");
      err_msg<signed_char>(&local_50,t,expected);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar1 = lVar1 + 3;
  } while (lVar1 != 0x1d);
  return;
}

Assistant:

void PostIncTestInt8()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_int8); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int8_t > si(inc_int8[i].x);
			SafeInt< std::int8_t > vv = si++;

			if(vv != inc_int8[i].x)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_int8[i].fExpected )
		{
			err_msg( "Error in case inc_int8 throw (2): ", inc_int8[i].x, inc_int8[i].fExpected );
		}
	}
}